

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

REF_STATUS node(REF_MPI ref_mpi,int argc,char **argv)

{
  uint uVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  REF_GRID_conflict ref_grid;
  REF_INT local;
  REF_GRID_conflict local_40;
  REF_INT local_34;
  
  local_40 = (REF_GRID)0x0;
  if (ref_mpi->n < 2) {
    if (argc < 4) {
      if (ref_mpi->id != 0) {
        return 1;
      }
      quilt_help(*argv);
      return 1;
    }
    pcVar4 = argv[2];
    printf("import %s\n",pcVar4);
    uVar1 = ref_import_by_extension(&local_40,ref_mpi,pcVar4);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x1002,"node",(ulong)uVar1,"load surface");
      return uVar1;
    }
    uVar3 = 4;
    if (4 < argc) {
      uVar3 = (ulong)(uint)argc;
    }
    uVar5 = 3;
    do {
      uVar1 = atoi(argv[uVar5]);
      printf("global index %d\n",(ulong)uVar1);
      uVar1 = ref_node_local(local_40->node,(long)(int)uVar1,&local_34);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1008,"node",(ulong)uVar1,"global node_index not found");
        return uVar1;
      }
      uVar1 = ref_node_location(local_40->node,local_34);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x1009,"node",(ulong)uVar1,"location");
        return uVar1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    uVar1 = ref_grid_free(local_40);
    if (uVar1 == 0) {
      return 0;
    }
    pcVar4 = "create";
    uVar2 = 0x100c;
    uVar3 = (ulong)uVar1;
  }
  else {
    pcVar4 = "ref node is not parallel";
    uVar1 = 6;
    uVar2 = 0xffc;
    uVar3 = 6;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
         uVar2,"node",uVar3,pcVar4);
  return uVar1;
}

Assistant:

static REF_STATUS node(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *in_file;
  REF_INT pos, global, local;
  REF_GRID ref_grid = NULL;

  if (ref_mpi_para(ref_mpi)) {
    RSS(REF_IMPLEMENT, "ref node is not parallel");
  }
  if (argc < 4) goto shutdown;
  in_file = argv[2];

  printf("import %s\n", in_file);
  RSS(ref_import_by_extension(&ref_grid, ref_mpi, in_file), "load surface");

  for (pos = 3; pos < argc; pos++) {
    global = atoi(argv[pos]);
    printf("global index %d\n", global);
    RSS(ref_node_local(ref_grid_node(ref_grid), global, &local),
        "global node_index not found");
    RSS(ref_node_location(ref_grid_node(ref_grid), local), "location");
  }

  RSS(ref_grid_free(ref_grid), "create");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) quilt_help(argv[0]);
  return REF_FAILURE;
}